

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void __thiscall
Omega_h::Write<long>::Write(Write<long> *this,LO size_in,long offset,long stride,string *name_in)

{
  Write<int> WStack_28;
  
  Write(this,size_in,name_in);
  Write(&WStack_28,(Write<int> *)this);
  fill_linear<long>((Write<long> *)&WStack_28,offset,stride);
  ~Write((Write<long> *)&WStack_28);
  return;
}

Assistant:

Write<T>::Write(LO size_in, T offset, T stride, std::string const& name_in)
    : Write<T>(size_in, name_in) {
  fill_linear(*this, offset, stride);
}